

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  string *psVar2;
  cmGeneratorTarget *pcVar3;
  cmLocalNinjaGenerator *pcVar4;
  cmOSXBundleGenerator *this_00;
  string local_70;
  string local_50;
  allocator local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00cc09e0;
  std::__cxx11::string::string((string *)&this->TargetNameOut);
  std::__cxx11::string::string((string *)&this->TargetNameSO);
  std::__cxx11::string::string((string *)&this->TargetNameReal);
  std::__cxx11::string::string((string *)&this->TargetNameImport);
  std::__cxx11::string::string((string *)&this->TargetNamePDB);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->TargetLinkLanguage,"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  pcVar3 = local_18;
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetLinkerLanguage(&local_50,pcVar3,psVar2);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  TVar1 = cmGeneratorTarget::GetType(local_18);
  if (TVar1 == EXECUTABLE) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    psVar2 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(&pcVar4->super_cmLocalCommonGenerator)
    ;
    cmGeneratorTarget::GetExecutableNames
              (pcVar3,&this->TargetNameOut,&this->TargetNameReal,&this->TargetNameImport,
               &this->TargetNamePDB,psVar2);
  }
  else {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    psVar2 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(&pcVar4->super_cmLocalCommonGenerator)
    ;
    cmGeneratorTarget::GetLibraryNames
              (pcVar3,&this->TargetNameOut,&this->TargetNameSO,&this->TargetNameReal,
               &this->TargetNameImport,&this->TargetNamePDB,psVar2);
  }
  TVar1 = cmGeneratorTarget::GetType(local_18);
  pcVar3 = local_18;
  if (TVar1 != OBJECT_LIBRARY) {
    psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetDirectory(&local_70,pcVar3,psVar2,RuntimeBinaryArtifact);
    cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  pcVar3 = local_18;
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,pcVar3,psVar2);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_00;
  cmOSXBundleGenerator::SetMacContentFolders
            ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,
             &(this->super_cmNinjaTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetNameOut()
  , TargetNameSO()
  , TargetNameReal()
  , TargetNameImport()
  , TargetNamePDB()
  , TargetLinkLanguage("")
  , DeviceLinkObject()
{
  this->TargetLinkLanguage = target->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    this->GetGeneratorTarget()->GetExecutableNames(
      this->TargetNameOut, this->TargetNameReal, this->TargetNameImport,
      this->TargetNamePDB, GetLocalGenerator()->GetConfigName());
  } else {
    this->GetGeneratorTarget()->GetLibraryNames(
      this->TargetNameOut, this->TargetNameSO, this->TargetNameReal,
      this->TargetNameImport, this->TargetNamePDB,
      GetLocalGenerator()->GetConfigName());
  }

  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->GetDirectory(this->GetConfigName()));
  }

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}